

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsIntPermuteConvertCopy
              (FmsIntType src_type,void *src,FmsIntType dst_type,void *dst,int *perm,
              FmsInt tuple_size,FmsInt tot_size)

{
  long in_RCX;
  uint in_EDX;
  long in_RSI;
  uint in_EDI;
  long in_R8;
  ulong in_R9;
  ulong in_stack_00000008;
  FmsInt j_63;
  uint64_t *loc_dst_63;
  uint64_t *loc_src_63;
  FmsInt i_63;
  FmsInt j_62;
  uint64_t *loc_dst_62;
  uint32_t *loc_src_62;
  FmsInt i_62;
  FmsInt j_61;
  uint64_t *loc_dst_61;
  uint16_t *loc_src_61;
  FmsInt i_61;
  FmsInt j_60;
  uint64_t *loc_dst_60;
  uint8_t *loc_src_60;
  FmsInt i_60;
  FmsInt j_59;
  uint64_t *loc_dst_59;
  int64_t *loc_src_59;
  FmsInt i_59;
  FmsInt j_58;
  uint64_t *loc_dst_58;
  int32_t *loc_src_58;
  FmsInt i_58;
  FmsInt j_57;
  uint64_t *loc_dst_57;
  int16_t *loc_src_57;
  FmsInt i_57;
  FmsInt j_56;
  uint64_t *loc_dst_56;
  int8_t *loc_src_56;
  FmsInt i_56;
  FmsInt j_55;
  uint32_t *loc_dst_55;
  uint64_t *loc_src_55;
  FmsInt i_55;
  FmsInt j_54;
  uint32_t *loc_dst_54;
  uint32_t *loc_src_54;
  FmsInt i_54;
  FmsInt j_53;
  uint32_t *loc_dst_53;
  uint16_t *loc_src_53;
  FmsInt i_53;
  FmsInt j_52;
  uint32_t *loc_dst_52;
  uint8_t *loc_src_52;
  FmsInt i_52;
  FmsInt j_51;
  uint32_t *loc_dst_51;
  int64_t *loc_src_51;
  FmsInt i_51;
  FmsInt j_50;
  uint32_t *loc_dst_50;
  int32_t *loc_src_50;
  FmsInt i_50;
  FmsInt j_49;
  uint32_t *loc_dst_49;
  int16_t *loc_src_49;
  FmsInt i_49;
  FmsInt j_48;
  uint32_t *loc_dst_48;
  int8_t *loc_src_48;
  FmsInt i_48;
  FmsInt j_47;
  uint16_t *loc_dst_47;
  uint64_t *loc_src_47;
  FmsInt i_47;
  FmsInt j_46;
  uint16_t *loc_dst_46;
  uint32_t *loc_src_46;
  FmsInt i_46;
  FmsInt j_45;
  uint16_t *loc_dst_45;
  uint16_t *loc_src_45;
  FmsInt i_45;
  FmsInt j_44;
  uint16_t *loc_dst_44;
  uint8_t *loc_src_44;
  FmsInt i_44;
  FmsInt j_43;
  uint16_t *loc_dst_43;
  int64_t *loc_src_43;
  FmsInt i_43;
  FmsInt j_42;
  uint16_t *loc_dst_42;
  int32_t *loc_src_42;
  FmsInt i_42;
  FmsInt j_41;
  uint16_t *loc_dst_41;
  int16_t *loc_src_41;
  FmsInt i_41;
  FmsInt j_40;
  uint16_t *loc_dst_40;
  int8_t *loc_src_40;
  FmsInt i_40;
  FmsInt j_39;
  uint8_t *loc_dst_39;
  uint64_t *loc_src_39;
  FmsInt i_39;
  FmsInt j_38;
  uint8_t *loc_dst_38;
  uint32_t *loc_src_38;
  FmsInt i_38;
  FmsInt j_37;
  uint8_t *loc_dst_37;
  uint16_t *loc_src_37;
  FmsInt i_37;
  FmsInt j_36;
  uint8_t *loc_dst_36;
  uint8_t *loc_src_36;
  FmsInt i_36;
  FmsInt j_35;
  uint8_t *loc_dst_35;
  int64_t *loc_src_35;
  FmsInt i_35;
  FmsInt j_34;
  uint8_t *loc_dst_34;
  int32_t *loc_src_34;
  FmsInt i_34;
  FmsInt j_33;
  uint8_t *loc_dst_33;
  int16_t *loc_src_33;
  FmsInt i_33;
  FmsInt j_32;
  uint8_t *loc_dst_32;
  int8_t *loc_src_32;
  FmsInt i_32;
  FmsInt j_31;
  int64_t *loc_dst_31;
  uint64_t *loc_src_31;
  FmsInt i_31;
  FmsInt j_30;
  int64_t *loc_dst_30;
  uint32_t *loc_src_30;
  FmsInt i_30;
  FmsInt j_29;
  int64_t *loc_dst_29;
  uint16_t *loc_src_29;
  FmsInt i_29;
  FmsInt j_28;
  int64_t *loc_dst_28;
  uint8_t *loc_src_28;
  FmsInt i_28;
  FmsInt j_27;
  int64_t *loc_dst_27;
  int64_t *loc_src_27;
  FmsInt i_27;
  FmsInt j_26;
  int64_t *loc_dst_26;
  int32_t *loc_src_26;
  FmsInt i_26;
  FmsInt j_25;
  int64_t *loc_dst_25;
  int16_t *loc_src_25;
  FmsInt i_25;
  FmsInt j_24;
  int64_t *loc_dst_24;
  int8_t *loc_src_24;
  FmsInt i_24;
  FmsInt j_23;
  int32_t *loc_dst_23;
  uint64_t *loc_src_23;
  FmsInt i_23;
  FmsInt j_22;
  int32_t *loc_dst_22;
  uint32_t *loc_src_22;
  FmsInt i_22;
  FmsInt j_21;
  int32_t *loc_dst_21;
  uint16_t *loc_src_21;
  FmsInt i_21;
  FmsInt j_20;
  int32_t *loc_dst_20;
  uint8_t *loc_src_20;
  FmsInt i_20;
  FmsInt j_19;
  int32_t *loc_dst_19;
  int64_t *loc_src_19;
  FmsInt i_19;
  FmsInt j_18;
  int32_t *loc_dst_18;
  int32_t *loc_src_18;
  FmsInt i_18;
  FmsInt j_17;
  int32_t *loc_dst_17;
  int16_t *loc_src_17;
  FmsInt i_17;
  FmsInt j_16;
  int32_t *loc_dst_16;
  int8_t *loc_src_16;
  FmsInt i_16;
  FmsInt j_15;
  int16_t *loc_dst_15;
  uint64_t *loc_src_15;
  FmsInt i_15;
  FmsInt j_14;
  int16_t *loc_dst_14;
  uint32_t *loc_src_14;
  FmsInt i_14;
  FmsInt j_13;
  int16_t *loc_dst_13;
  uint16_t *loc_src_13;
  FmsInt i_13;
  FmsInt j_12;
  int16_t *loc_dst_12;
  uint8_t *loc_src_12;
  FmsInt i_12;
  FmsInt j_11;
  int16_t *loc_dst_11;
  int64_t *loc_src_11;
  FmsInt i_11;
  FmsInt j_10;
  int16_t *loc_dst_10;
  int32_t *loc_src_10;
  FmsInt i_10;
  FmsInt j_9;
  int16_t *loc_dst_9;
  int16_t *loc_src_9;
  FmsInt i_9;
  FmsInt j_8;
  int16_t *loc_dst_8;
  int8_t *loc_src_8;
  FmsInt i_8;
  FmsInt j_7;
  int8_t *loc_dst_7;
  uint64_t *loc_src_7;
  FmsInt i_7;
  FmsInt j_6;
  int8_t *loc_dst_6;
  uint32_t *loc_src_6;
  FmsInt i_6;
  FmsInt j_5;
  int8_t *loc_dst_5;
  uint16_t *loc_src_5;
  FmsInt i_5;
  FmsInt j_4;
  int8_t *loc_dst_4;
  uint8_t *loc_src_4;
  FmsInt i_4;
  FmsInt j_3;
  int8_t *loc_dst_3;
  int64_t *loc_src_3;
  FmsInt i_3;
  FmsInt j_2;
  int8_t *loc_dst_2;
  int32_t *loc_src_2;
  FmsInt i_2;
  FmsInt j_1;
  int8_t *loc_dst_1;
  int16_t *loc_src_1;
  FmsInt i_1;
  FmsInt j;
  int8_t *loc_dst;
  int8_t *loc_src;
  FmsInt i;
  FmsInt ts;
  ulong local_838;
  ulong local_820;
  ulong local_818;
  ulong local_800;
  ulong local_7f8;
  ulong local_7e0;
  ulong local_7d8;
  ulong local_7c0;
  ulong local_7b8;
  ulong local_7a0;
  ulong local_798;
  ulong local_780;
  ulong local_778;
  ulong local_760;
  ulong local_758;
  ulong local_740;
  ulong local_738;
  ulong local_720;
  ulong local_718;
  ulong local_700;
  ulong local_6f8;
  ulong local_6e0;
  ulong local_6d8;
  ulong local_6c0;
  ulong local_6b8;
  ulong local_6a0;
  ulong local_698;
  ulong local_680;
  ulong local_678;
  ulong local_660;
  ulong local_658;
  ulong local_640;
  ulong local_638;
  ulong local_620;
  ulong local_618;
  ulong local_600;
  ulong local_5f8;
  ulong local_5e0;
  ulong local_5d8;
  ulong local_5c0;
  ulong local_5b8;
  ulong local_5a0;
  ulong local_598;
  ulong local_580;
  ulong local_578;
  ulong local_560;
  ulong local_558;
  ulong local_540;
  ulong local_538;
  ulong local_520;
  ulong local_518;
  ulong local_500;
  ulong local_4f8;
  ulong local_4e0;
  ulong local_4d8;
  ulong local_4c0;
  ulong local_4b8;
  ulong local_4a0;
  ulong local_498;
  ulong local_480;
  ulong local_478;
  ulong local_460;
  ulong local_458;
  ulong local_440;
  ulong local_438;
  ulong local_420;
  ulong local_418;
  ulong local_400;
  ulong local_3f8;
  ulong local_3e0;
  ulong local_3d8;
  ulong local_3c0;
  ulong local_3b8;
  ulong local_3a0;
  ulong local_398;
  ulong local_380;
  ulong local_378;
  ulong local_360;
  ulong local_358;
  ulong local_340;
  ulong local_338;
  ulong local_320;
  ulong local_318;
  ulong local_300;
  ulong local_2f8;
  ulong local_2e0;
  ulong local_2d8;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2a0;
  ulong local_298;
  ulong local_280;
  ulong local_278;
  ulong local_260;
  ulong local_258;
  ulong local_240;
  ulong local_238;
  ulong local_220;
  ulong local_218;
  ulong local_200;
  ulong local_1f8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1a0;
  ulong local_198;
  ulong local_180;
  ulong local_178;
  ulong local_160;
  ulong local_158;
  ulong local_140;
  ulong local_138;
  ulong local_120;
  ulong local_118;
  ulong local_100;
  ulong local_f8;
  ulong local_e0;
  ulong local_d8;
  ulong local_c0;
  ulong local_b8;
  ulong local_a0;
  ulong local_98;
  ulong local_80;
  ulong local_78;
  ulong local_60;
  ulong local_58;
  ulong local_40;
  int local_4;
  
  if ((in_EDI < 8) && (in_EDX < 8)) {
    if ((in_R9 == 0) || (in_stack_00000008 % in_R9 != 0)) {
      local_4 = 2;
    }
    else {
      switch(in_EDX) {
      case 0:
        switch(in_EDI) {
        case 0:
          for (local_40 = 0; local_40 < in_stack_00000008; local_40 = in_R9 + local_40) {
            for (local_58 = 0; local_58 < in_R9; local_58 = local_58 + 1) {
              *(undefined1 *)(in_RCX + local_40 + local_58) =
                   *(undefined1 *)(in_RSI + local_40 + (long)*(int *)(in_R8 + local_58 * 4));
            }
          }
          break;
        case 1:
          for (local_60 = 0; local_60 < in_stack_00000008; local_60 = in_R9 + local_60) {
            for (local_78 = 0; local_78 < in_R9; local_78 = local_78 + 1) {
              *(char *)(in_RCX + local_60 + local_78) =
                   (char)*(undefined2 *)
                          (in_RSI + local_60 * 2 + (long)*(int *)(in_R8 + local_78 * 4) * 2);
            }
          }
          break;
        case 2:
          for (local_80 = 0; local_80 < in_stack_00000008; local_80 = in_R9 + local_80) {
            for (local_98 = 0; local_98 < in_R9; local_98 = local_98 + 1) {
              *(char *)(in_RCX + local_80 + local_98) =
                   (char)*(undefined4 *)
                          (in_RSI + local_80 * 4 + (long)*(int *)(in_R8 + local_98 * 4) * 4);
            }
          }
          break;
        case 3:
          for (local_a0 = 0; local_a0 < in_stack_00000008; local_a0 = in_R9 + local_a0) {
            for (local_b8 = 0; local_b8 < in_R9; local_b8 = local_b8 + 1) {
              *(char *)(in_RCX + local_a0 + local_b8) =
                   (char)*(undefined8 *)
                          (in_RSI + local_a0 * 8 + (long)*(int *)(in_R8 + local_b8 * 4) * 8);
            }
          }
          break;
        case 4:
          for (local_c0 = 0; local_c0 < in_stack_00000008; local_c0 = in_R9 + local_c0) {
            for (local_d8 = 0; local_d8 < in_R9; local_d8 = local_d8 + 1) {
              *(undefined1 *)(in_RCX + local_c0 + local_d8) =
                   *(undefined1 *)(in_RSI + local_c0 + (long)*(int *)(in_R8 + local_d8 * 4));
            }
          }
          break;
        case 5:
          for (local_e0 = 0; local_e0 < in_stack_00000008; local_e0 = in_R9 + local_e0) {
            for (local_f8 = 0; local_f8 < in_R9; local_f8 = local_f8 + 1) {
              *(char *)(in_RCX + local_e0 + local_f8) =
                   (char)*(undefined2 *)
                          (in_RSI + local_e0 * 2 + (long)*(int *)(in_R8 + local_f8 * 4) * 2);
            }
          }
          break;
        case 6:
          for (local_100 = 0; local_100 < in_stack_00000008; local_100 = in_R9 + local_100) {
            for (local_118 = 0; local_118 < in_R9; local_118 = local_118 + 1) {
              *(char *)(in_RCX + local_100 + local_118) =
                   (char)*(undefined4 *)
                          (in_RSI + local_100 * 4 + (long)*(int *)(in_R8 + local_118 * 4) * 4);
            }
          }
          break;
        case 7:
          for (local_120 = 0; local_120 < in_stack_00000008; local_120 = in_R9 + local_120) {
            for (local_138 = 0; local_138 < in_R9; local_138 = local_138 + 1) {
              *(char *)(in_RCX + local_120 + local_138) =
                   (char)*(undefined8 *)
                          (in_RSI + local_120 * 8 + (long)*(int *)(in_R8 + local_138 * 4) * 8);
            }
          }
          break;
        default:
          FmsAbortNotImplemented();
        }
        break;
      case 1:
        switch(in_EDI) {
        case 0:
          for (local_140 = 0; local_140 < in_stack_00000008; local_140 = in_R9 + local_140) {
            for (local_158 = 0; local_158 < in_R9; local_158 = local_158 + 1) {
              *(short *)(in_RCX + local_140 * 2 + local_158 * 2) =
                   (short)*(char *)(in_RSI + local_140 + (long)*(int *)(in_R8 + local_158 * 4));
            }
          }
          break;
        case 1:
          for (local_160 = 0; local_160 < in_stack_00000008; local_160 = in_R9 + local_160) {
            for (local_178 = 0; local_178 < in_R9; local_178 = local_178 + 1) {
              *(undefined2 *)(in_RCX + local_160 * 2 + local_178 * 2) =
                   *(undefined2 *)
                    (in_RSI + local_160 * 2 + (long)*(int *)(in_R8 + local_178 * 4) * 2);
            }
          }
          break;
        case 2:
          for (local_180 = 0; local_180 < in_stack_00000008; local_180 = in_R9 + local_180) {
            for (local_198 = 0; local_198 < in_R9; local_198 = local_198 + 1) {
              *(short *)(in_RCX + local_180 * 2 + local_198 * 2) =
                   (short)*(undefined4 *)
                           (in_RSI + local_180 * 4 + (long)*(int *)(in_R8 + local_198 * 4) * 4);
            }
          }
          break;
        case 3:
          for (local_1a0 = 0; local_1a0 < in_stack_00000008; local_1a0 = in_R9 + local_1a0) {
            for (local_1b8 = 0; local_1b8 < in_R9; local_1b8 = local_1b8 + 1) {
              *(short *)(in_RCX + local_1a0 * 2 + local_1b8 * 2) =
                   (short)*(undefined8 *)
                           (in_RSI + local_1a0 * 8 + (long)*(int *)(in_R8 + local_1b8 * 4) * 8);
            }
          }
          break;
        case 4:
          for (local_1c0 = 0; local_1c0 < in_stack_00000008; local_1c0 = in_R9 + local_1c0) {
            for (local_1d8 = 0; local_1d8 < in_R9; local_1d8 = local_1d8 + 1) {
              *(ushort *)(in_RCX + local_1c0 * 2 + local_1d8 * 2) =
                   (ushort)*(byte *)(in_RSI + local_1c0 + (long)*(int *)(in_R8 + local_1d8 * 4));
            }
          }
          break;
        case 5:
          for (local_1e0 = 0; local_1e0 < in_stack_00000008; local_1e0 = in_R9 + local_1e0) {
            for (local_1f8 = 0; local_1f8 < in_R9; local_1f8 = local_1f8 + 1) {
              *(undefined2 *)(in_RCX + local_1e0 * 2 + local_1f8 * 2) =
                   *(undefined2 *)
                    (in_RSI + local_1e0 * 2 + (long)*(int *)(in_R8 + local_1f8 * 4) * 2);
            }
          }
          break;
        case 6:
          for (local_200 = 0; local_200 < in_stack_00000008; local_200 = in_R9 + local_200) {
            for (local_218 = 0; local_218 < in_R9; local_218 = local_218 + 1) {
              *(short *)(in_RCX + local_200 * 2 + local_218 * 2) =
                   (short)*(undefined4 *)
                           (in_RSI + local_200 * 4 + (long)*(int *)(in_R8 + local_218 * 4) * 4);
            }
          }
          break;
        case 7:
          for (local_220 = 0; local_220 < in_stack_00000008; local_220 = in_R9 + local_220) {
            for (local_238 = 0; local_238 < in_R9; local_238 = local_238 + 1) {
              *(short *)(in_RCX + local_220 * 2 + local_238 * 2) =
                   (short)*(undefined8 *)
                           (in_RSI + local_220 * 8 + (long)*(int *)(in_R8 + local_238 * 4) * 8);
            }
          }
          break;
        default:
          FmsAbortNotImplemented();
        }
        break;
      case 2:
        switch(in_EDI) {
        case 0:
          for (local_240 = 0; local_240 < in_stack_00000008; local_240 = in_R9 + local_240) {
            for (local_258 = 0; local_258 < in_R9; local_258 = local_258 + 1) {
              *(int *)(in_RCX + local_240 * 4 + local_258 * 4) =
                   (int)*(char *)(in_RSI + local_240 + (long)*(int *)(in_R8 + local_258 * 4));
            }
          }
          break;
        case 1:
          for (local_260 = 0; local_260 < in_stack_00000008; local_260 = in_R9 + local_260) {
            for (local_278 = 0; local_278 < in_R9; local_278 = local_278 + 1) {
              *(int *)(in_RCX + local_260 * 4 + local_278 * 4) =
                   (int)*(short *)(in_RSI + local_260 * 2 +
                                  (long)*(int *)(in_R8 + local_278 * 4) * 2);
            }
          }
          break;
        case 2:
          for (local_280 = 0; local_280 < in_stack_00000008; local_280 = in_R9 + local_280) {
            for (local_298 = 0; local_298 < in_R9; local_298 = local_298 + 1) {
              *(undefined4 *)(in_RCX + local_280 * 4 + local_298 * 4) =
                   *(undefined4 *)
                    (in_RSI + local_280 * 4 + (long)*(int *)(in_R8 + local_298 * 4) * 4);
            }
          }
          break;
        case 3:
          for (local_2a0 = 0; local_2a0 < in_stack_00000008; local_2a0 = in_R9 + local_2a0) {
            for (local_2b8 = 0; local_2b8 < in_R9; local_2b8 = local_2b8 + 1) {
              *(int *)(in_RCX + local_2a0 * 4 + local_2b8 * 4) =
                   (int)*(undefined8 *)
                         (in_RSI + local_2a0 * 8 + (long)*(int *)(in_R8 + local_2b8 * 4) * 8);
            }
          }
          break;
        case 4:
          for (local_2c0 = 0; local_2c0 < in_stack_00000008; local_2c0 = in_R9 + local_2c0) {
            for (local_2d8 = 0; local_2d8 < in_R9; local_2d8 = local_2d8 + 1) {
              *(uint *)(in_RCX + local_2c0 * 4 + local_2d8 * 4) =
                   (uint)*(byte *)(in_RSI + local_2c0 + (long)*(int *)(in_R8 + local_2d8 * 4));
            }
          }
          break;
        case 5:
          for (local_2e0 = 0; local_2e0 < in_stack_00000008; local_2e0 = in_R9 + local_2e0) {
            for (local_2f8 = 0; local_2f8 < in_R9; local_2f8 = local_2f8 + 1) {
              *(uint *)(in_RCX + local_2e0 * 4 + local_2f8 * 4) =
                   (uint)*(ushort *)
                          (in_RSI + local_2e0 * 2 + (long)*(int *)(in_R8 + local_2f8 * 4) * 2);
            }
          }
          break;
        case 6:
          for (local_300 = 0; local_300 < in_stack_00000008; local_300 = in_R9 + local_300) {
            for (local_318 = 0; local_318 < in_R9; local_318 = local_318 + 1) {
              *(undefined4 *)(in_RCX + local_300 * 4 + local_318 * 4) =
                   *(undefined4 *)
                    (in_RSI + local_300 * 4 + (long)*(int *)(in_R8 + local_318 * 4) * 4);
            }
          }
          break;
        case 7:
          for (local_320 = 0; local_320 < in_stack_00000008; local_320 = in_R9 + local_320) {
            for (local_338 = 0; local_338 < in_R9; local_338 = local_338 + 1) {
              *(int *)(in_RCX + local_320 * 4 + local_338 * 4) =
                   (int)*(undefined8 *)
                         (in_RSI + local_320 * 8 + (long)*(int *)(in_R8 + local_338 * 4) * 8);
            }
          }
          break;
        default:
          FmsAbortNotImplemented();
        }
        break;
      case 3:
        switch(in_EDI) {
        case 0:
          for (local_340 = 0; local_340 < in_stack_00000008; local_340 = in_R9 + local_340) {
            for (local_358 = 0; local_358 < in_R9; local_358 = local_358 + 1) {
              *(long *)(in_RCX + local_340 * 8 + local_358 * 8) =
                   (long)*(char *)(in_RSI + local_340 + (long)*(int *)(in_R8 + local_358 * 4));
            }
          }
          break;
        case 1:
          for (local_360 = 0; local_360 < in_stack_00000008; local_360 = in_R9 + local_360) {
            for (local_378 = 0; local_378 < in_R9; local_378 = local_378 + 1) {
              *(long *)(in_RCX + local_360 * 8 + local_378 * 8) =
                   (long)*(short *)(in_RSI + local_360 * 2 +
                                   (long)*(int *)(in_R8 + local_378 * 4) * 2);
            }
          }
          break;
        case 2:
          for (local_380 = 0; local_380 < in_stack_00000008; local_380 = in_R9 + local_380) {
            for (local_398 = 0; local_398 < in_R9; local_398 = local_398 + 1) {
              *(long *)(in_RCX + local_380 * 8 + local_398 * 8) =
                   (long)*(int *)(in_RSI + local_380 * 4 + (long)*(int *)(in_R8 + local_398 * 4) * 4
                                 );
            }
          }
          break;
        case 3:
          for (local_3a0 = 0; local_3a0 < in_stack_00000008; local_3a0 = in_R9 + local_3a0) {
            for (local_3b8 = 0; local_3b8 < in_R9; local_3b8 = local_3b8 + 1) {
              *(undefined8 *)(in_RCX + local_3a0 * 8 + local_3b8 * 8) =
                   *(undefined8 *)
                    (in_RSI + local_3a0 * 8 + (long)*(int *)(in_R8 + local_3b8 * 4) * 8);
            }
          }
          break;
        case 4:
          for (local_3c0 = 0; local_3c0 < in_stack_00000008; local_3c0 = in_R9 + local_3c0) {
            for (local_3d8 = 0; local_3d8 < in_R9; local_3d8 = local_3d8 + 1) {
              *(ulong *)(in_RCX + local_3c0 * 8 + local_3d8 * 8) =
                   (ulong)*(byte *)(in_RSI + local_3c0 + (long)*(int *)(in_R8 + local_3d8 * 4));
            }
          }
          break;
        case 5:
          for (local_3e0 = 0; local_3e0 < in_stack_00000008; local_3e0 = in_R9 + local_3e0) {
            for (local_3f8 = 0; local_3f8 < in_R9; local_3f8 = local_3f8 + 1) {
              *(ulong *)(in_RCX + local_3e0 * 8 + local_3f8 * 8) =
                   (ulong)*(ushort *)
                           (in_RSI + local_3e0 * 2 + (long)*(int *)(in_R8 + local_3f8 * 4) * 2);
            }
          }
          break;
        case 6:
          for (local_400 = 0; local_400 < in_stack_00000008; local_400 = in_R9 + local_400) {
            for (local_418 = 0; local_418 < in_R9; local_418 = local_418 + 1) {
              *(ulong *)(in_RCX + local_400 * 8 + local_418 * 8) =
                   (ulong)*(uint *)(in_RSI + local_400 * 4 +
                                   (long)*(int *)(in_R8 + local_418 * 4) * 4);
            }
          }
          break;
        case 7:
          for (local_420 = 0; local_420 < in_stack_00000008; local_420 = in_R9 + local_420) {
            for (local_438 = 0; local_438 < in_R9; local_438 = local_438 + 1) {
              *(undefined8 *)(in_RCX + local_420 * 8 + local_438 * 8) =
                   *(undefined8 *)
                    (in_RSI + local_420 * 8 + (long)*(int *)(in_R8 + local_438 * 4) * 8);
            }
          }
          break;
        default:
          FmsAbortNotImplemented();
        }
        break;
      case 4:
        switch(in_EDI) {
        case 0:
          for (local_440 = 0; local_440 < in_stack_00000008; local_440 = in_R9 + local_440) {
            for (local_458 = 0; local_458 < in_R9; local_458 = local_458 + 1) {
              *(undefined1 *)(in_RCX + local_440 + local_458) =
                   *(undefined1 *)(in_RSI + local_440 + (long)*(int *)(in_R8 + local_458 * 4));
            }
          }
          break;
        case 1:
          for (local_460 = 0; local_460 < in_stack_00000008; local_460 = in_R9 + local_460) {
            for (local_478 = 0; local_478 < in_R9; local_478 = local_478 + 1) {
              *(char *)(in_RCX + local_460 + local_478) =
                   (char)*(undefined2 *)
                          (in_RSI + local_460 * 2 + (long)*(int *)(in_R8 + local_478 * 4) * 2);
            }
          }
          break;
        case 2:
          for (local_480 = 0; local_480 < in_stack_00000008; local_480 = in_R9 + local_480) {
            for (local_498 = 0; local_498 < in_R9; local_498 = local_498 + 1) {
              *(char *)(in_RCX + local_480 + local_498) =
                   (char)*(undefined4 *)
                          (in_RSI + local_480 * 4 + (long)*(int *)(in_R8 + local_498 * 4) * 4);
            }
          }
          break;
        case 3:
          for (local_4a0 = 0; local_4a0 < in_stack_00000008; local_4a0 = in_R9 + local_4a0) {
            for (local_4b8 = 0; local_4b8 < in_R9; local_4b8 = local_4b8 + 1) {
              *(char *)(in_RCX + local_4a0 + local_4b8) =
                   (char)*(undefined8 *)
                          (in_RSI + local_4a0 * 8 + (long)*(int *)(in_R8 + local_4b8 * 4) * 8);
            }
          }
          break;
        case 4:
          for (local_4c0 = 0; local_4c0 < in_stack_00000008; local_4c0 = in_R9 + local_4c0) {
            for (local_4d8 = 0; local_4d8 < in_R9; local_4d8 = local_4d8 + 1) {
              *(undefined1 *)(in_RCX + local_4c0 + local_4d8) =
                   *(undefined1 *)(in_RSI + local_4c0 + (long)*(int *)(in_R8 + local_4d8 * 4));
            }
          }
          break;
        case 5:
          for (local_4e0 = 0; local_4e0 < in_stack_00000008; local_4e0 = in_R9 + local_4e0) {
            for (local_4f8 = 0; local_4f8 < in_R9; local_4f8 = local_4f8 + 1) {
              *(char *)(in_RCX + local_4e0 + local_4f8) =
                   (char)*(undefined2 *)
                          (in_RSI + local_4e0 * 2 + (long)*(int *)(in_R8 + local_4f8 * 4) * 2);
            }
          }
          break;
        case 6:
          for (local_500 = 0; local_500 < in_stack_00000008; local_500 = in_R9 + local_500) {
            for (local_518 = 0; local_518 < in_R9; local_518 = local_518 + 1) {
              *(char *)(in_RCX + local_500 + local_518) =
                   (char)*(undefined4 *)
                          (in_RSI + local_500 * 4 + (long)*(int *)(in_R8 + local_518 * 4) * 4);
            }
          }
          break;
        case 7:
          for (local_520 = 0; local_520 < in_stack_00000008; local_520 = in_R9 + local_520) {
            for (local_538 = 0; local_538 < in_R9; local_538 = local_538 + 1) {
              *(char *)(in_RCX + local_520 + local_538) =
                   (char)*(undefined8 *)
                          (in_RSI + local_520 * 8 + (long)*(int *)(in_R8 + local_538 * 4) * 8);
            }
          }
          break;
        default:
          FmsAbortNotImplemented();
        }
        break;
      case 5:
        switch(in_EDI) {
        case 0:
          for (local_540 = 0; local_540 < in_stack_00000008; local_540 = in_R9 + local_540) {
            for (local_558 = 0; local_558 < in_R9; local_558 = local_558 + 1) {
              *(short *)(in_RCX + local_540 * 2 + local_558 * 2) =
                   (short)*(char *)(in_RSI + local_540 + (long)*(int *)(in_R8 + local_558 * 4));
            }
          }
          break;
        case 1:
          for (local_560 = 0; local_560 < in_stack_00000008; local_560 = in_R9 + local_560) {
            for (local_578 = 0; local_578 < in_R9; local_578 = local_578 + 1) {
              *(undefined2 *)(in_RCX + local_560 * 2 + local_578 * 2) =
                   *(undefined2 *)
                    (in_RSI + local_560 * 2 + (long)*(int *)(in_R8 + local_578 * 4) * 2);
            }
          }
          break;
        case 2:
          for (local_580 = 0; local_580 < in_stack_00000008; local_580 = in_R9 + local_580) {
            for (local_598 = 0; local_598 < in_R9; local_598 = local_598 + 1) {
              *(short *)(in_RCX + local_580 * 2 + local_598 * 2) =
                   (short)*(undefined4 *)
                           (in_RSI + local_580 * 4 + (long)*(int *)(in_R8 + local_598 * 4) * 4);
            }
          }
          break;
        case 3:
          for (local_5a0 = 0; local_5a0 < in_stack_00000008; local_5a0 = in_R9 + local_5a0) {
            for (local_5b8 = 0; local_5b8 < in_R9; local_5b8 = local_5b8 + 1) {
              *(short *)(in_RCX + local_5a0 * 2 + local_5b8 * 2) =
                   (short)*(undefined8 *)
                           (in_RSI + local_5a0 * 8 + (long)*(int *)(in_R8 + local_5b8 * 4) * 8);
            }
          }
          break;
        case 4:
          for (local_5c0 = 0; local_5c0 < in_stack_00000008; local_5c0 = in_R9 + local_5c0) {
            for (local_5d8 = 0; local_5d8 < in_R9; local_5d8 = local_5d8 + 1) {
              *(ushort *)(in_RCX + local_5c0 * 2 + local_5d8 * 2) =
                   (ushort)*(byte *)(in_RSI + local_5c0 + (long)*(int *)(in_R8 + local_5d8 * 4));
            }
          }
          break;
        case 5:
          for (local_5e0 = 0; local_5e0 < in_stack_00000008; local_5e0 = in_R9 + local_5e0) {
            for (local_5f8 = 0; local_5f8 < in_R9; local_5f8 = local_5f8 + 1) {
              *(undefined2 *)(in_RCX + local_5e0 * 2 + local_5f8 * 2) =
                   *(undefined2 *)
                    (in_RSI + local_5e0 * 2 + (long)*(int *)(in_R8 + local_5f8 * 4) * 2);
            }
          }
          break;
        case 6:
          for (local_600 = 0; local_600 < in_stack_00000008; local_600 = in_R9 + local_600) {
            for (local_618 = 0; local_618 < in_R9; local_618 = local_618 + 1) {
              *(short *)(in_RCX + local_600 * 2 + local_618 * 2) =
                   (short)*(undefined4 *)
                           (in_RSI + local_600 * 4 + (long)*(int *)(in_R8 + local_618 * 4) * 4);
            }
          }
          break;
        case 7:
          for (local_620 = 0; local_620 < in_stack_00000008; local_620 = in_R9 + local_620) {
            for (local_638 = 0; local_638 < in_R9; local_638 = local_638 + 1) {
              *(short *)(in_RCX + local_620 * 2 + local_638 * 2) =
                   (short)*(undefined8 *)
                           (in_RSI + local_620 * 8 + (long)*(int *)(in_R8 + local_638 * 4) * 8);
            }
          }
          break;
        default:
          FmsAbortNotImplemented();
        }
        break;
      case 6:
        switch(in_EDI) {
        case 0:
          for (local_640 = 0; local_640 < in_stack_00000008; local_640 = in_R9 + local_640) {
            for (local_658 = 0; local_658 < in_R9; local_658 = local_658 + 1) {
              *(int *)(in_RCX + local_640 * 4 + local_658 * 4) =
                   (int)*(char *)(in_RSI + local_640 + (long)*(int *)(in_R8 + local_658 * 4));
            }
          }
          break;
        case 1:
          for (local_660 = 0; local_660 < in_stack_00000008; local_660 = in_R9 + local_660) {
            for (local_678 = 0; local_678 < in_R9; local_678 = local_678 + 1) {
              *(int *)(in_RCX + local_660 * 4 + local_678 * 4) =
                   (int)*(short *)(in_RSI + local_660 * 2 +
                                  (long)*(int *)(in_R8 + local_678 * 4) * 2);
            }
          }
          break;
        case 2:
          for (local_680 = 0; local_680 < in_stack_00000008; local_680 = in_R9 + local_680) {
            for (local_698 = 0; local_698 < in_R9; local_698 = local_698 + 1) {
              *(undefined4 *)(in_RCX + local_680 * 4 + local_698 * 4) =
                   *(undefined4 *)
                    (in_RSI + local_680 * 4 + (long)*(int *)(in_R8 + local_698 * 4) * 4);
            }
          }
          break;
        case 3:
          for (local_6a0 = 0; local_6a0 < in_stack_00000008; local_6a0 = in_R9 + local_6a0) {
            for (local_6b8 = 0; local_6b8 < in_R9; local_6b8 = local_6b8 + 1) {
              *(int *)(in_RCX + local_6a0 * 4 + local_6b8 * 4) =
                   (int)*(undefined8 *)
                         (in_RSI + local_6a0 * 8 + (long)*(int *)(in_R8 + local_6b8 * 4) * 8);
            }
          }
          break;
        case 4:
          for (local_6c0 = 0; local_6c0 < in_stack_00000008; local_6c0 = in_R9 + local_6c0) {
            for (local_6d8 = 0; local_6d8 < in_R9; local_6d8 = local_6d8 + 1) {
              *(uint *)(in_RCX + local_6c0 * 4 + local_6d8 * 4) =
                   (uint)*(byte *)(in_RSI + local_6c0 + (long)*(int *)(in_R8 + local_6d8 * 4));
            }
          }
          break;
        case 5:
          for (local_6e0 = 0; local_6e0 < in_stack_00000008; local_6e0 = in_R9 + local_6e0) {
            for (local_6f8 = 0; local_6f8 < in_R9; local_6f8 = local_6f8 + 1) {
              *(uint *)(in_RCX + local_6e0 * 4 + local_6f8 * 4) =
                   (uint)*(ushort *)
                          (in_RSI + local_6e0 * 2 + (long)*(int *)(in_R8 + local_6f8 * 4) * 2);
            }
          }
          break;
        case 6:
          for (local_700 = 0; local_700 < in_stack_00000008; local_700 = in_R9 + local_700) {
            for (local_718 = 0; local_718 < in_R9; local_718 = local_718 + 1) {
              *(undefined4 *)(in_RCX + local_700 * 4 + local_718 * 4) =
                   *(undefined4 *)
                    (in_RSI + local_700 * 4 + (long)*(int *)(in_R8 + local_718 * 4) * 4);
            }
          }
          break;
        case 7:
          for (local_720 = 0; local_720 < in_stack_00000008; local_720 = in_R9 + local_720) {
            for (local_738 = 0; local_738 < in_R9; local_738 = local_738 + 1) {
              *(int *)(in_RCX + local_720 * 4 + local_738 * 4) =
                   (int)*(undefined8 *)
                         (in_RSI + local_720 * 8 + (long)*(int *)(in_R8 + local_738 * 4) * 8);
            }
          }
          break;
        default:
          FmsAbortNotImplemented();
        }
        break;
      case 7:
        switch(in_EDI) {
        case 0:
          for (local_740 = 0; local_740 < in_stack_00000008; local_740 = in_R9 + local_740) {
            for (local_758 = 0; local_758 < in_R9; local_758 = local_758 + 1) {
              *(long *)(in_RCX + local_740 * 8 + local_758 * 8) =
                   (long)*(char *)(in_RSI + local_740 + (long)*(int *)(in_R8 + local_758 * 4));
            }
          }
          break;
        case 1:
          for (local_760 = 0; local_760 < in_stack_00000008; local_760 = in_R9 + local_760) {
            for (local_778 = 0; local_778 < in_R9; local_778 = local_778 + 1) {
              *(long *)(in_RCX + local_760 * 8 + local_778 * 8) =
                   (long)*(short *)(in_RSI + local_760 * 2 +
                                   (long)*(int *)(in_R8 + local_778 * 4) * 2);
            }
          }
          break;
        case 2:
          for (local_780 = 0; local_780 < in_stack_00000008; local_780 = in_R9 + local_780) {
            for (local_798 = 0; local_798 < in_R9; local_798 = local_798 + 1) {
              *(long *)(in_RCX + local_780 * 8 + local_798 * 8) =
                   (long)*(int *)(in_RSI + local_780 * 4 + (long)*(int *)(in_R8 + local_798 * 4) * 4
                                 );
            }
          }
          break;
        case 3:
          for (local_7a0 = 0; local_7a0 < in_stack_00000008; local_7a0 = in_R9 + local_7a0) {
            for (local_7b8 = 0; local_7b8 < in_R9; local_7b8 = local_7b8 + 1) {
              *(undefined8 *)(in_RCX + local_7a0 * 8 + local_7b8 * 8) =
                   *(undefined8 *)
                    (in_RSI + local_7a0 * 8 + (long)*(int *)(in_R8 + local_7b8 * 4) * 8);
            }
          }
          break;
        case 4:
          for (local_7c0 = 0; local_7c0 < in_stack_00000008; local_7c0 = in_R9 + local_7c0) {
            for (local_7d8 = 0; local_7d8 < in_R9; local_7d8 = local_7d8 + 1) {
              *(ulong *)(in_RCX + local_7c0 * 8 + local_7d8 * 8) =
                   (ulong)*(byte *)(in_RSI + local_7c0 + (long)*(int *)(in_R8 + local_7d8 * 4));
            }
          }
          break;
        case 5:
          for (local_7e0 = 0; local_7e0 < in_stack_00000008; local_7e0 = in_R9 + local_7e0) {
            for (local_7f8 = 0; local_7f8 < in_R9; local_7f8 = local_7f8 + 1) {
              *(ulong *)(in_RCX + local_7e0 * 8 + local_7f8 * 8) =
                   (ulong)*(ushort *)
                           (in_RSI + local_7e0 * 2 + (long)*(int *)(in_R8 + local_7f8 * 4) * 2);
            }
          }
          break;
        case 6:
          for (local_800 = 0; local_800 < in_stack_00000008; local_800 = in_R9 + local_800) {
            for (local_818 = 0; local_818 < in_R9; local_818 = local_818 + 1) {
              *(ulong *)(in_RCX + local_800 * 8 + local_818 * 8) =
                   (ulong)*(uint *)(in_RSI + local_800 * 4 +
                                   (long)*(int *)(in_R8 + local_818 * 4) * 4);
            }
          }
          break;
        case 7:
          for (local_820 = 0; local_820 < in_stack_00000008; local_820 = in_R9 + local_820) {
            for (local_838 = 0; local_838 < in_R9; local_838 = local_838 + 1) {
              *(undefined8 *)(in_RCX + local_820 * 8 + local_838 * 8) =
                   *(undefined8 *)
                    (in_RSI + local_820 * 8 + (long)*(int *)(in_R8 + local_838 * 4) * 8);
            }
          }
          break;
        default:
          FmsAbortNotImplemented();
        }
        break;
      default:
        FmsAbortNotImplemented();
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int FmsIntPermuteConvertCopy(FmsIntType src_type, const void *src,
                                    FmsIntType dst_type, void *dst,
                                    const int *perm, FmsInt tuple_size,
                                    FmsInt tot_size) {
  if (src_type >= FMS_NUM_INT_TYPES || dst_type >= FMS_NUM_INT_TYPES) {
    E_RETURN(1);
  }
  if (tuple_size == 0 || tot_size % tuple_size != 0) { E_RETURN(2); }
  const FmsInt ts = tuple_size;
  switch (dst_type) {
  case FMS_INT8:   FMS_IPCC_SW(src_type,src,  int8_t,dst,ts,perm,tot_size);
  case FMS_INT16:  FMS_IPCC_SW(src_type,src, int16_t,dst,ts,perm,tot_size);
  case FMS_INT32:  FMS_IPCC_SW(src_type,src, int32_t,dst,ts,perm,tot_size);
  case FMS_INT64:  FMS_IPCC_SW(src_type,src, int64_t,dst,ts,perm,tot_size);
  case FMS_UINT8:  FMS_IPCC_SW(src_type,src, uint8_t,dst,ts,perm,tot_size);
  case FMS_UINT16: FMS_IPCC_SW(src_type,src,uint16_t,dst,ts,perm,tot_size);
  case FMS_UINT32: FMS_IPCC_SW(src_type,src,uint32_t,dst,ts,perm,tot_size);
  case FMS_UINT64: FMS_IPCC_SW(src_type,src,uint64_t,dst,ts,perm,tot_size);
  default: FmsAbortNotImplemented();
  }
  return 0;
}